

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<unsigned_char,_8UL>::resize
          (ArrayWithPreallocation<unsigned_char,_8UL> *this,size_t newSize)

{
  ulong uVar1;
  
  if (this->numActive < newSize) {
    reserve(this,newSize);
    while (uVar1 = this->numActive, uVar1 < newSize) {
      this->numActive = uVar1 + 1;
      this->items[uVar1] = '\0';
    }
    return;
  }
  shrink(this,newSize);
  return;
}

Assistant:

void resize (size_t newSize)
    {
        if (newSize > numActive)
        {
            reserve (newSize);

            while (numActive < newSize)
                new (items + numActive++) Item (Item());
        }
        else
        {
            shrink (newSize);
        }
    }